

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O2

uint32_t yatrie_char_add(uint32_t parent_id,uint8_t char_index,trie_s *trie)

{
  nodes_s *pnVar1;
  ulong uVar2;
  byte insert_pos;
  uint32_t uVar3;
  uint8_t uVar4;
  undefined7 in_register_00000031;
  int iVar5;
  
  pnVar1 = trie->nodes;
  uVar2 = (ulong)parent_id;
  iVar5 = (int)CONCAT71(in_register_00000031,char_index) + -1;
  insert_pos = bit_int32_count((uint32_t *)(pnVar1 + uVar2 * 2 + 1),'\x01',(uint8_t)iVar5);
  uVar4 = '\0';
  if ((char_index & 0x1f) != 0) {
    uVar4 = char_index;
  }
  if (((&pnVar1[uVar2 * 2 + 1].increment)[iVar5 >> 5] >> ((byte)(uVar4 - 1) & 0x1f) & 1) != 0) {
    return (&trie->refs[1].increment)[(uint)insert_pos + pnVar1[uVar2 * 2 + 2].size];
  }
  uVar3 = node_insert_ref(char_index,insert_pos,(node_s *)(pnVar1 + uVar2 * 2 + 1),trie);
  return uVar3;
}

Assistant:

uint32_t yatrie_char_add(uint32_t parent_id, uint8_t char_index, trie_s *trie) {
    uint32_t next_node_id;
    uint8_t bits;
    uint8_t pos;
    node_s *parent_node = NODE_GET(parent_id, trie);

    //number of chars (bits) before the current char (bit) position in the alphabet
    //count the number of bits to determine the position of the char
    pos = bit_int32_count(parent_node->mask, 1, char_index - 1);

    //if char exists in the bitmask we need to get next node_s id from the references block
    if (BIT_ARRAY_GET(parent_node->mask, char_index)) {
        next_node_id = REF_GET(parent_node->ref_id, pos, trie);
    } else {
        //else we create new references block bigger than before to insert new reference
        next_node_id = node_insert_ref(char_index, pos, parent_node, trie);
    }

    return next_node_id;
}